

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_avx512bw_harley_seal(uint16_t *array,uint32_t len,uint32_t *flags)

{
  size_t i;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  undefined1 (*pauVar4) [64];
  long lVar5;
  ulong uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar39 [16];
  undefined1 in_ZMM25 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar40 [64];
  undefined1 in_ZMM28 [64];
  uint16_t buffer [32];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  if ((len & 0x1ff) != 0) {
    uVar1 = (ulong)(len & 0xfffffe00);
    auVar12 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar13 = vpmovsxbd_avx512f(_DAT_0011f080);
    auVar14 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      auVar15 = vpbroadcastd_avx512f();
      auVar15 = vpsrlvd_avx512f(auVar15,auVar13);
      auVar15 = vpandd_avx512f(auVar15,auVar14);
      auVar12 = vpaddd_avx512f(auVar15,auVar12);
      uVar1 = uVar1 + 1;
    } while (uVar1 < len);
    auVar12 = vmovdqu64_avx512f(auVar12);
    *(undefined1 (*) [64])flags = auVar12;
  }
  uVar7 = len >> 5 & 0xfffffff0;
  uVar1 = (ulong)uVar7;
  auVar9 = in_ZMM28._0_16_;
  auVar10 = in_ZMM22._0_16_;
  auVar39 = in_ZMM25._0_16_;
  auVar8 = in_ZMM21._0_16_;
  if (uVar7 == 0) {
    auVar9 = vpxord_avx512vl(auVar9,auVar9);
    auVar15 = ZEXT1664(auVar9);
    auVar10 = vpxord_avx512vl(auVar10,auVar10);
    auVar14 = ZEXT1664(auVar10);
    auVar10 = vpxord_avx512vl(auVar39,auVar39);
    auVar12 = ZEXT1664(auVar10);
    auVar8 = vpxord_avx512vl(auVar8,auVar8);
    auVar13 = ZEXT1664(auVar8);
  }
  else {
    auVar8 = vpxord_avx512vl(auVar8,auVar8);
    auVar13 = ZEXT1664(auVar8);
    auVar8 = vpxord_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
    auVar40 = ZEXT1664(auVar8);
    uVar6 = 0;
    auVar8 = vpxord_avx512vl(auVar39,auVar39);
    auVar12 = ZEXT1664(auVar8);
    auVar8 = vpxord_avx512vl(auVar10,auVar10);
    auVar14 = ZEXT1664(auVar8);
    auVar8 = vpxord_avx512vl(auVar9,auVar9);
    auVar15 = ZEXT1664(auVar8);
    do {
      local_5c0 = vmovdqa64_avx512f(auVar15);
      local_580 = vmovdqa64_avx512f(auVar14);
      local_540 = vmovdqa64_avx512f(auVar13);
      local_500 = vmovdqa64_avx512f(auVar40);
      local_4c0 = vmovdqa64_avx512f(auVar12);
      memset(local_480,0,0x400);
      uVar2 = uVar6 + 0xffff;
      if (uVar1 - uVar6 < 0x10000) {
        uVar2 = uVar1;
      }
      if (uVar6 < uVar2) {
        auVar16 = vmovdqa64_avx512f(local_440);
        auVar17 = vmovdqa64_avx512f(local_400);
        auVar18 = vmovdqa64_avx512f(local_3c0);
        auVar19 = vmovdqa64_avx512f(local_380);
        auVar20 = vmovdqa64_avx512f(local_340);
        auVar21 = vmovdqa64_avx512f(local_300);
        auVar22 = vmovdqa64_avx512f(local_2c0);
        auVar23 = vmovdqa64_avx512f(local_280);
        auVar24 = vmovdqa64_avx512f(local_240);
        auVar25 = vmovdqa64_avx512f(local_200);
        auVar26 = vmovdqa64_avx512f(local_1c0);
        auVar27 = vmovdqa64_avx512f(local_180);
        auVar28 = vmovdqa64_avx512f(local_140);
        auVar29 = vmovdqa64_avx512f(local_100);
        auVar30 = vmovdqa64_avx512f(local_c0);
        pauVar4 = (undefined1 (*) [64])(array + uVar6 * 0x20 + 0x1e0);
        auVar38 = ZEXT1664((undefined1  [16])0x0);
        auVar12 = vmovdqa64_avx512f(local_4c0);
        auVar40 = vmovdqa64_avx512f(local_500);
        auVar31 = vpbroadcastw_avx512bw(ZEXT216(1));
        auVar13 = vmovdqa64_avx512f(local_540);
        auVar14 = vmovdqa64_avx512f(local_580);
        auVar15 = vmovdqa64_avx512f(local_5c0);
        do {
          auVar13 = vmovdqa64_avx512f(auVar13);
          auVar32 = vmovdqu64_avx512f(pauVar4[-0xf]);
          auVar33 = vmovdqu64_avx512f(pauVar4[-0xe]);
          auVar34 = vmovdqu64_avx512f(pauVar4[-0xd]);
          auVar35 = vmovdqu64_avx512f(pauVar4[-0xc]);
          auVar36 = vmovdqa64_avx512f(auVar33);
          auVar36 = vpternlogd_avx512f(auVar36,auVar32,auVar15,0xe8);
          auVar15 = vpternlogd_avx512f(auVar33,auVar32,auVar15,0x96);
          auVar32 = vmovdqa64_avx512f(auVar35);
          auVar32 = vpternlogd_avx512f(auVar32,auVar34,auVar15,0xe8);
          auVar15 = vpternlogd_avx512f(auVar15,auVar34,auVar35,0x96);
          auVar33 = vmovdqa64_avx512f(auVar32);
          auVar33 = vpternlogd_avx512f(auVar33,auVar36,auVar14,0xe8);
          auVar14 = vpternlogd_avx512f(auVar32,auVar36,auVar14,0x96);
          auVar32 = vmovdqu64_avx512f(pauVar4[-0xb]);
          auVar34 = vmovdqu64_avx512f(pauVar4[-10]);
          auVar35 = vmovdqa64_avx512f(auVar34);
          auVar35 = vpternlogd_avx512f(auVar35,auVar32,auVar15,0xe8);
          auVar15 = vpternlogd_avx512f(auVar15,auVar32,auVar34,0x96);
          auVar32 = vmovdqu64_avx512f(pauVar4[-9]);
          auVar34 = vmovdqu64_avx512f(pauVar4[-8]);
          auVar36 = vmovdqa64_avx512f(auVar34);
          auVar36 = vpternlogd_avx512f(auVar36,auVar32,auVar15,0xe8);
          auVar15 = vpternlogd_avx512f(auVar15,auVar32,auVar34,0x96);
          auVar32 = vmovdqa64_avx512f(auVar36);
          auVar32 = vpternlogd_avx512f(auVar32,auVar35,auVar14,0xe8);
          auVar14 = vpternlogd_avx512f(auVar36,auVar35,auVar14,0x96);
          auVar34 = vmovdqa64_avx512f(auVar32);
          auVar34 = vpternlogd_avx512f(auVar34,auVar33,auVar12,0xe8);
          auVar12 = vpternlogd_avx512f(auVar32,auVar33,auVar12,0x96);
          auVar32 = vmovdqu64_avx512f(pauVar4[-7]);
          auVar33 = vmovdqu64_avx512f(pauVar4[-6]);
          auVar35 = vmovdqa64_avx512f(auVar33);
          auVar35 = vpternlogd_avx512f(auVar35,auVar32,auVar15,0xe8);
          auVar15 = vpternlogd_avx512f(auVar15,auVar32,auVar33,0x96);
          auVar32 = vmovdqu64_avx512f(pauVar4[-5]);
          auVar33 = vmovdqu64_avx512f(pauVar4[-4]);
          auVar36 = vmovdqa64_avx512f(auVar33);
          auVar36 = vpternlogd_avx512f(auVar36,auVar32,auVar15,0xe8);
          auVar15 = vpternlogd_avx512f(auVar15,auVar32,auVar33,0x96);
          auVar32 = vmovdqa64_avx512f(auVar36);
          auVar32 = vpternlogd_avx512f(auVar32,auVar35,auVar14,0xe8);
          auVar14 = vpternlogd_avx512f(auVar36,auVar35,auVar14,0x96);
          auVar33 = vmovdqu64_avx512f(pauVar4[-3]);
          auVar35 = vmovdqu64_avx512f(pauVar4[-2]);
          auVar36 = vmovdqa64_avx512f(auVar35);
          auVar36 = vpternlogd_avx512f(auVar36,auVar33,auVar15,0xe8);
          auVar33 = vpternlogd_avx512f(auVar15,auVar33,auVar35,0x96);
          auVar35 = vmovdqu64_avx512f(pauVar4[-1]);
          auVar37 = vmovdqu64_avx512f(*pauVar4);
          auVar15 = vmovdqa64_avx512f(auVar33);
          auVar15 = vpternlogd_avx512f(auVar15,auVar35,auVar37,0x96);
          auVar33 = vpternlogd_avx512f(auVar37,auVar35,auVar33,0xe8);
          auVar35 = vmovdqa64_avx512f(auVar33);
          auVar35 = vpternlogd_avx512f(auVar35,auVar36,auVar14,0xe8);
          auVar14 = vpternlogd_avx512f(auVar33,auVar36,auVar14,0x96);
          auVar33 = vmovdqa64_avx512f(auVar35);
          auVar33 = vpternlogd_avx512f(auVar33,auVar32,auVar12,0xe8);
          auVar12 = vpternlogd_avx512f(auVar35,auVar32,auVar12,0x96);
          auVar32 = vpandq_avx512f(auVar40,auVar31);
          auVar38 = vpaddw_avx512bw(auVar38,auVar32);
          auVar32 = vpsrlw_avx512bw(auVar40,1);
          auVar32 = vpandq_avx512f(auVar32,auVar31);
          auVar16 = vpaddw_avx512bw(auVar16,auVar32);
          auVar32 = vpsrlw_avx512bw(auVar40,2);
          auVar32 = vpandq_avx512f(auVar32,auVar31);
          auVar17 = vpaddw_avx512bw(auVar17,auVar32);
          auVar32 = vpsrlw_avx512bw(auVar40,3);
          auVar32 = vpandq_avx512f(auVar32,auVar31);
          auVar18 = vpaddw_avx512bw(auVar18,auVar32);
          auVar32 = vpsrlw_avx512bw(auVar40,4);
          auVar32 = vpandq_avx512f(auVar32,auVar31);
          auVar19 = vpaddw_avx512bw(auVar19,auVar32);
          auVar32 = vpsrlw_avx512bw(auVar40,5);
          auVar32 = vpandq_avx512f(auVar32,auVar31);
          auVar20 = vpaddw_avx512bw(auVar20,auVar32);
          auVar32 = vpsrlw_avx512bw(auVar40,6);
          auVar32 = vpandq_avx512f(auVar32,auVar31);
          auVar21 = vpaddw_avx512bw(auVar21,auVar32);
          auVar32 = vpsrlw_avx512bw(auVar40,7);
          auVar32 = vpandq_avx512f(auVar32,auVar31);
          auVar22 = vpaddw_avx512bw(auVar22,auVar32);
          auVar32 = vpsrlw_avx512bw(auVar40,8);
          auVar32 = vpandq_avx512f(auVar32,auVar31);
          auVar23 = vpaddw_avx512bw(auVar23,auVar32);
          auVar32 = vpsrlw_avx512bw(auVar40,9);
          auVar32 = vpandq_avx512f(auVar32,auVar31);
          auVar24 = vpaddw_avx512bw(auVar24,auVar32);
          auVar32 = vpsrlw_avx512bw(auVar40,10);
          auVar32 = vpandq_avx512f(auVar32,auVar31);
          auVar25 = vpaddw_avx512bw(auVar25,auVar32);
          auVar32 = vpsrlw_avx512bw(auVar40,0xb);
          auVar32 = vpandq_avx512f(auVar32,auVar31);
          auVar26 = vpaddw_avx512bw(auVar26,auVar32);
          auVar32 = vpsrlw_avx512bw(auVar40,0xc);
          auVar32 = vpandq_avx512f(auVar32,auVar31);
          auVar27 = vpaddw_avx512bw(auVar27,auVar32);
          auVar32 = vpsrlw_avx512bw(auVar40,0xd);
          auVar32 = vpandq_avx512f(auVar32,auVar31);
          auVar28 = vpaddw_avx512bw(auVar28,auVar32);
          auVar32 = vpsrlw_avx512bw(auVar40,0xe);
          auVar32 = vpandq_avx512f(auVar32,auVar31);
          auVar29 = vpaddw_avx512bw(auVar29,auVar32);
          auVar40 = vpsrlw_avx512bw(auVar40,0xf);
          auVar30 = vpaddw_avx512bw(auVar30,auVar40);
          auVar40 = vmovdqa64_avx512f(auVar33);
          auVar40 = vpternlogd_avx512f(auVar40,auVar34,auVar13,0xe8);
          auVar13 = vpternlogd_avx512f(auVar33,auVar34,auVar13,0x96);
          uVar6 = uVar6 + 0x10;
          pauVar4 = pauVar4 + 0x10;
        } while (uVar6 < uVar2);
        local_440 = vmovdqa64_avx512f(auVar16);
        local_400 = vmovdqa64_avx512f(auVar17);
        local_3c0 = vmovdqa64_avx512f(auVar18);
        local_380 = vmovdqa64_avx512f(auVar19);
        local_340 = vmovdqa64_avx512f(auVar20);
        local_300 = vmovdqa64_avx512f(auVar21);
        local_2c0 = vmovdqa64_avx512f(auVar22);
        local_280 = vmovdqa64_avx512f(auVar23);
        local_240 = vmovdqa64_avx512f(auVar24);
        local_200 = vmovdqa64_avx512f(auVar25);
        local_1c0 = vmovdqa64_avx512f(auVar26);
        local_180 = vmovdqa64_avx512f(auVar27);
        local_140 = vmovdqa64_avx512f(auVar28);
        local_100 = vmovdqa64_avx512f(auVar29);
        local_c0 = vmovdqa64_avx512f(auVar30);
      }
      else {
        auVar38 = ZEXT1664((undefined1  [16])0x0);
        auVar12 = vmovdqa64_avx512f(local_4c0);
        auVar40 = vmovdqa64_avx512f(local_500);
        auVar31 = vpbroadcastw_avx512bw(ZEXT216(1));
        auVar13 = vmovdqa64_avx512f(local_540);
        auVar14 = vmovdqa64_avx512f(local_580);
        auVar15 = vmovdqa64_avx512f(local_5c0);
      }
      local_480 = vmovdqa64_avx512f(auVar38);
      lVar3 = 0;
      do {
        auVar38 = vpandq_avx512f(auVar40,auVar31);
        auVar38 = vpaddw_avx512bw(auVar38,*(undefined1 (*) [64])(local_480 + lVar3));
        auVar38 = vmovdqa64_avx512f(auVar38);
        *(undefined1 (*) [64])(local_480 + lVar3) = auVar38;
        auVar40 = vpsrlw_avx512bw(auVar40,1);
        lVar3 = lVar3 + 0x40;
      } while (lVar3 != 0x400);
      lVar3 = 0;
      do {
        lVar5 = lVar3 * 0x40;
        uStack_5f8 = *(undefined8 *)(local_480 + lVar5 + 8);
        local_600 = *(undefined8 *)(local_480 + lVar5);
        uStack_5f0 = *(undefined8 *)(local_480 + lVar5 + 0x10);
        uStack_5e8 = *(undefined8 *)(local_480 + lVar5 + 0x18);
        uStack_5e0 = *(undefined8 *)(local_480 + lVar5 + 0x20);
        uStack_5d8 = *(undefined8 *)(local_440 + lVar5 + -0x18);
        uStack_5d0 = *(undefined8 *)(local_440 + lVar5 + -0x10);
        uStack_5c8 = *(undefined8 *)(local_440 + lVar5 + -8);
        auVar31 = ZEXT464(flags[lVar3]);
        lVar5 = 0;
        do {
          auVar38 = vpmovzxwd_avx512f(*(undefined1 (*) [32])((long)&local_600 + lVar5 * 2));
          auVar38 = vpslld_avx512f(auVar38,4);
          auVar31 = vpaddd_avx512f(auVar38,auVar31);
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x20);
        auVar11 = vextracti64x4_avx512f(auVar31,1);
        auVar31 = vpaddd_avx512f(auVar31,ZEXT3264(auVar11));
        auVar8 = vpaddd_avx(auVar31._0_16_,auVar31._16_16_);
        auVar10 = vpshufd_avx(auVar8,0xee);
        auVar8 = vpaddd_avx(auVar8,auVar10);
        auVar10 = vpshufd_avx(auVar8,0x55);
        auVar8 = vpaddd_avx(auVar8,auVar10);
        flags[lVar3] = auVar8._0_4_;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
    } while (uVar6 < uVar1);
  }
  vmovdqu64_avx512f(auVar15);
  auVar15 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  lVar3 = 0;
  auVar40 = vpmovsxbd_avx512f(_DAT_0011f080);
  auVar31 = vpbroadcastd_avx512f(ZEXT416(1));
  do {
    auVar38 = vpbroadcastd_avx512f();
    auVar38 = vpsrlvd_avx512f(auVar38,auVar40);
    auVar38 = vpandd_avx512f(auVar38,auVar31);
    auVar15 = vpaddd_avx512f(auVar38,auVar15);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x20);
  auVar15 = vmovdqu64_avx512f(auVar15);
  *(undefined1 (*) [64])flags = auVar15;
  vmovdqu64_avx512f(auVar14);
  auVar14 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  lVar3 = 0;
  auVar15 = vpbroadcastd_avx512f(ZEXT416(2));
  do {
    auVar31 = vpbroadcastd_avx512f();
    auVar31 = vpsrlvd_avx512f(auVar31,auVar40);
    auVar31 = vpaddd_avx512f(auVar31,auVar31);
    auVar31 = vpandd_avx512f(auVar31,auVar15);
    auVar14 = vpaddd_avx512f(auVar31,auVar14);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x20);
  auVar14 = vmovdqu64_avx512f(auVar14);
  *(undefined1 (*) [64])flags = auVar14;
  vmovdqu64_avx512f(auVar12);
  auVar12 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  lVar3 = 0;
  auVar14 = vpbroadcastd_avx512f(ZEXT416(4));
  do {
    auVar15 = vpbroadcastd_avx512f();
    auVar15 = vpsrlvd_avx512f(auVar15,auVar40);
    auVar15 = vpslld_avx512f(auVar15,2);
    auVar15 = vpandd_avx512f(auVar15,auVar14);
    auVar12 = vpaddd_avx512f(auVar15,auVar12);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x20);
  auVar12 = vmovdqu64_avx512f(auVar12);
  *(undefined1 (*) [64])flags = auVar12;
  vmovdqu64_avx512f(auVar13);
  auVar12 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  lVar3 = 0;
  auVar13 = vpbroadcastd_avx512f(ZEXT416(8));
  do {
    auVar14 = vpbroadcastd_avx512f();
    auVar14 = vpsrlvd_avx512f(auVar14,auVar40);
    auVar14 = vpslld_avx512f(auVar14,3);
    auVar14 = vpandd_avx512f(auVar14,auVar13);
    auVar12 = vpaddd_avx512f(auVar14,auVar12);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x20);
  auVar12 = vmovdqu64_avx512f(auVar12);
  *(undefined1 (*) [64])flags = auVar12;
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_harley_seal(const uint16_t* array, uint32_t len, uint32_t* flags) {
    for (uint32_t i = len - (len % (32 * 16)); i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m512i* data = (const __m512i*)array;
    __m512i v1  = _mm512_setzero_si512();
    __m512i v2  = _mm512_setzero_si512();
    __m512i v4  = _mm512_setzero_si512();
    __m512i v8  = _mm512_setzero_si512();
    __m512i v16 = _mm512_setzero_si512();
    __m512i twosA, twosB, foursA, foursB, eightsA, eightsB;
    __m512i counter[16];

    const size_t size = len / 32;
    const uint64_t limit = size - size % 16;

    uint16_t buffer[32];

    uint64_t i = 0;
    while (i < limit) {
        for (size_t i = 0; i < 16; ++i)
            counter[i] = _mm512_setzero_si512();

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
#define U(pos) {                     \
    counter[pos] = _mm512_add_epi16(counter[pos], _mm512_and_si512(v16, _mm512_set1_epi16(1))); \
    v16 = _mm512_srli_epi16(v16, 1); \
}
            pospopcnt_csa_avx512(&twosA,   &v1, _mm512_loadu_si512(data + i + 0), _mm512_loadu_si512(data + i + 1));
            pospopcnt_csa_avx512(&twosB,   &v1, _mm512_loadu_si512(data + i + 2), _mm512_loadu_si512(data + i + 3));
            pospopcnt_csa_avx512(&foursA,  &v2, twosA, twosB);
            pospopcnt_csa_avx512(&twosA,   &v1, _mm512_loadu_si512(data + i + 4), _mm512_loadu_si512(data + i + 5));
            pospopcnt_csa_avx512(&twosB,   &v1, _mm512_loadu_si512(data + i + 6), _mm512_loadu_si512(data + i + 7));
            pospopcnt_csa_avx512(&foursB,  &v2, twosA, twosB);
            pospopcnt_csa_avx512(&eightsA, &v4, foursA, foursB);
            pospopcnt_csa_avx512(&twosA,   &v1, _mm512_loadu_si512(data + i + 8),  _mm512_loadu_si512(data + i + 9));
            pospopcnt_csa_avx512(&twosB,   &v1, _mm512_loadu_si512(data + i + 10), _mm512_loadu_si512(data + i + 11));
            pospopcnt_csa_avx512(&foursA,  &v2, twosA, twosB);
            pospopcnt_csa_avx512(&twosA,   &v1, _mm512_loadu_si512(data + i + 12), _mm512_loadu_si512(data + i + 13));
            pospopcnt_csa_avx512(&twosB,   &v1, _mm512_loadu_si512(data + i + 14), _mm512_loadu_si512(data + i + 15));
            pospopcnt_csa_avx512(&foursB,  &v2, twosA, twosB);
            pospopcnt_csa_avx512(&eightsB, &v4, foursA, foursB);
            U(0) U(1) U(2) U(3) U(4) U(5) U(6) U(7) U(8) U(9) U(10) U(11) U(12) U(13) U(14) U(15) // Updates
            pospopcnt_csa_avx512(&v16,     &v8, eightsA, eightsB);
        }
        // Update the counters after the last iteration.
        for (size_t i = 0; i < 16; ++i) U(i)
#undef U
        
        for (size_t i = 0; i < 16; ++i) {
            _mm512_storeu_si512((__m512i*)buffer, counter[i]);
            for (size_t z = 0; z < 32; z++) {
                flags[i] += 16 * (uint32_t)buffer[z];
            }
        }
    }

    _mm512_storeu_si512((__m512i*)buffer, v1);
    for (size_t i = 0; i < 32; i++) {
        for (int j = 0; j < 16; j++) {
            flags[j] += 1 * ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm512_storeu_si512((__m512i*)buffer, v2);
    for (size_t i = 0; i < 32; i++) {
        for (int j = 0; j < 16; j++) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    
    _mm512_storeu_si512((__m512i*)buffer, v4);
    for (size_t i = 0; i < 32; i++) {
        for (int j = 0; j < 16; j++) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm512_storeu_si512((__m512i*)buffer, v8);
    for (size_t i = 0; i < 32; i++) {
        for (int j = 0; j < 16; j++) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    return 0;
}